

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O3

MPP_RET vdpp2_done(vdpp2_api_ctx *ctx)

{
  MPP_RET in_EAX;
  MPP_RET extraout_EAX;
  MPP_RET extraout_EAX_00;
  MPP_RET extraout_EAX_01;
  MPP_RET extraout_EAX_02;
  MPP_RET extraout_EAX_03;
  MPP_RET extraout_EAX_04;
  char *fname;
  char *fmt;
  int level;
  
  if (((byte)vdpp2_debug & 2) != 0) {
    _mpp_log_l(4,"vdpp2","ro_frm_done_sts=%d\n",(char *)0x0,
               (ulong)(*(byte *)&(ctx->reg).common.reg10 & 1));
    in_EAX = extraout_EAX;
    if (((byte)vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","ro_osd_max_sts=%d\n",(char *)0x0,
                 (ulong)((uint)(ctx->reg).common.reg10 >> 1 & 1));
      in_EAX = extraout_EAX_00;
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","ro_bus_error_sts=%d\n",(char *)0x0,
                   (ulong)((uint)(ctx->reg).common.reg10 >> 4 & 1));
        in_EAX = extraout_EAX_01;
        if (((byte)vdpp2_debug & 2) != 0) {
          _mpp_log_l(4,"vdpp2","ro_timeout_sts=%d\n",(char *)0x0,
                     (ulong)((uint)(ctx->reg).common.reg10 >> 5 & 1));
          in_EAX = extraout_EAX_02;
          if (((byte)vdpp2_debug & 2) != 0) {
            _mpp_log_l(4,"vdpp2","ro_config_error_sts=%d\n",(char *)0x0,
                       (ulong)((uint)(ctx->reg).common.reg10 >> 5 & 1));
            in_EAX = extraout_EAX_03;
          }
        }
      }
    }
  }
  if ((((uint)(ctx->reg).common.reg8 & 1) == 0) || (((uint)(ctx->reg).common.reg10 & 1) != 0)) {
    if (((byte)vdpp2_debug & 2) == 0) {
      return in_EAX;
    }
    fmt = "run vdpp success\n";
    level = 4;
    fname = (char *)0x0;
  }
  else {
    fmt = "run vdpp failed\n";
    fname = "vdpp2_done";
    level = 2;
  }
  _mpp_log_l(level,"vdpp2",fmt,fname);
  return extraout_EAX_04;
}

Assistant:

static MPP_RET vdpp2_done(struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *reg = &ctx->reg;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    reg = &ctx->reg;

    VDPP2_DBG(VDPP2_DBG_INT, "ro_frm_done_sts=%d\n", reg->common.reg10.ro_frm_done_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_osd_max_sts=%d\n", reg->common.reg10.ro_osd_max_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_bus_error_sts=%d\n", reg->common.reg10.ro_bus_error_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_timeout_sts=%d\n", reg->common.reg10.ro_timeout_sts);
    VDPP2_DBG(VDPP2_DBG_INT, "ro_config_error_sts=%d\n", reg->common.reg10.ro_timeout_sts);

    if (reg->common.reg8.sw_vdpp_frm_done_en &&
        !reg->common.reg10.ro_frm_done_sts) {
        mpp_err_f("run vdpp failed\n");
        return MPP_NOK;
    }

    VDPP2_DBG(VDPP2_DBG_INT, "run vdpp success\n");

    return MPP_OK;
}